

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::handle
          (PhysicalStorageBufferPointerHandler *this,Op op,uint32_t *args,uint32_t length)

{
  PhysicalBlockMeta *pPVar1;
  bool bVar2;
  pointer ppVar3;
  mapped_type *ppPVar4;
  _Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta_*>,_false>
  local_38;
  _Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta_*>,_false>
  local_30;
  iterator itr;
  uint32_t length_local;
  uint32_t *args_local;
  Op op_local;
  PhysicalStorageBufferPointerHandler *this_local;
  
  itr.
  super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta_*>,_false>
  ._M_cur._4_4_ = length;
  if (op == OpLoad) {
    setup_meta_chain(this,*args,args[1]);
    if (itr.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta_*>,_false>
        ._M_cur._4_4_ < 4) {
      return true;
    }
    mark_aligned_access(this,args[2],args + 3,
                        itr.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta_*>,_false>
                        ._M_cur._4_4_ - 3);
    return true;
  }
  if (op == OpStore) {
    if (length < 3) {
      return true;
    }
    mark_aligned_access(this,*args,args + 2,length - 2);
    return true;
  }
  if (op - OpAccessChain < 3) {
LAB_003c1c63:
    local_30._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta_*>_>_>
         ::find(&this->access_chain_to_physical_block,args + 2);
    local_38._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta_*>_>_>
         ::end(&this->access_chain_to_physical_block);
    bVar2 = ::std::__detail::operator!=(&local_30,&local_38);
    if (bVar2) {
      ppVar3 = ::std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta_*>,_false,_false>
                             *)&local_30);
      pPVar1 = ppVar3->second;
      ppPVar4 = ::std::
                unordered_map<unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta_*>_>_>
                ::operator[](&this->access_chain_to_physical_block,args + 1);
      *ppPVar4 = pPVar1;
    }
  }
  else {
    if (op != OpCompositeExtract) {
      if (op == OpCopyObject) goto LAB_003c1c63;
      if ((op != OpConvertUToPtr) && (op != OpBitcast)) {
        return true;
      }
    }
    setup_meta_chain(this,*args,args[1]);
  }
  return true;
}

Assistant:

bool Compiler::PhysicalStorageBufferPointerHandler::handle(Op op, const uint32_t *args, uint32_t length)
{
	// When a BDA pointer comes to life, we need to keep a mapping of SSA ID -> type ID for the pointer type.
	// For every load and store, we'll need to be able to look up the type ID being accessed and mark any alignment
	// requirements.
	switch (op)
	{
	case OpConvertUToPtr:
	case OpBitcast:
	case OpCompositeExtract:
		// Extract can begin a new chain if we had a struct or array of pointers as input.
		// We don't begin chains before we have a pure scalar pointer.
		setup_meta_chain(args[0], args[1]);
		break;

	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	case OpCopyObject:
	{
		auto itr = access_chain_to_physical_block.find(args[2]);
		if (itr != access_chain_to_physical_block.end())
			access_chain_to_physical_block[args[1]] = itr->second;
		break;
	}

	case OpLoad:
	{
		setup_meta_chain(args[0], args[1]);
		if (length >= 4)
			mark_aligned_access(args[2], args + 3, length - 3);
		break;
	}

	case OpStore:
	{
		if (length >= 3)
			mark_aligned_access(args[0], args + 2, length - 2);
		break;
	}

	case OpCooperativeMatrixLoadKHR:
	case OpCooperativeMatrixStoreKHR:
	{
		// TODO: Can we meaningfully deal with this?
		break;
	}

	default:
		break;
	}

	return true;
}